

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::DecompressZip
               (uchar *dst,unsigned_long *uncompressed_size,uchar *src,unsigned_long src_size)

{
  unsigned_long uVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  value_type *pvVar5;
  long lVar6;
  reference pvVar7;
  bool bVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  allocator_type local_49;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (*uncompressed_size == src_size) {
    memcpy(dst,src,src_size);
    bVar8 = true;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,*uncompressed_size
               ,&local_49);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0);
    iVar2 = mz_uncompress(pvVar3,uncompressed_size,src,src_size);
    bVar8 = iVar2 == 0;
    if (bVar8) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0);
      uVar1 = *uncompressed_size;
      while (pvVar7 = pvVar3 + 1, pvVar7 < pvVar4 + uVar1) {
        *pvVar7 = *pvVar7 + *pvVar3 + 0x80;
        pvVar3 = pvVar7;
      }
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0);
      uVar1 = *uncompressed_size;
      pvVar5 = dst + uVar1;
      lVar6 = 0;
      for (; dst < pvVar5; dst = dst + 2) {
        *dst = pvVar3[lVar6];
        if (pvVar5 <= dst + 1) break;
        dst[1] = pvVar4[lVar6 + (uVar1 + 1 >> 1)];
        lVar6 = lVar6 + 1;
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  }
  return bVar8;
}

Assistant:

static bool DecompressZip(unsigned char *dst,
                          unsigned long *uncompressed_size /* inout */,
                          const unsigned char *src, unsigned long src_size) {
  if ((*uncompressed_size) == src_size) {
    // Data is not compressed(Issue 40).
    memcpy(dst, src, src_size);
    return true;
  }
  std::vector<unsigned char> tmpBuf(*uncompressed_size);

#if TINYEXR_USE_MINIZ
  int ret =
      miniz::mz_uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  if (miniz::MZ_OK != ret) {
    return false;
  }
#else
  int ret = uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  if (Z_OK != ret) {
    return false;
  }
#endif

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + (*uncompressed_size);

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (*uncompressed_size + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + (*uncompressed_size);

    for (;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }

  return true;
}